

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O1

int uni_sem_wait(uni_sem_t *sem,uint timeout)

{
  sem_t *__sem;
  int iVar1;
  sem_t *s;
  timespec local_30;
  
  iVar1 = -2;
  if ((sem != (uni_sem_t *)0x0) && (__sem = (sem_t *)sem->hdl, __sem != (sem_t *)0x0)) {
    if (timeout == 0xffffffff) {
      sem_wait(__sem);
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      clock_gettime(0,&local_30);
      local_30.tv_sec = local_30.tv_sec + (ulong)timeout / 1000;
      local_30.tv_nsec = (ulong)((timeout % 1000) * 1000000) + local_30.tv_nsec;
      if (999999999 < (ulong)local_30.tv_nsec) {
        local_30.tv_sec = local_30.tv_sec + 1;
        local_30.tv_nsec = local_30.tv_nsec - 1000000000;
      }
      sem_timedwait(__sem,&local_30);
    }
  }
  return iVar1;
}

Assistant:

int uni_sem_wait(uni_sem_t *sem, unsigned int timeout) {
    if (NULL_PTR_CHECK(sem) || NULL_PTR_CHECK(sem->hdl)) {
        return -INVALID_IN_PARAM;
    }

    if (timeout == UNI_WAIT_FOREVER) {
        sem_wait((sem_t *)sem->hdl);
        return OK;
    }

    __sem_timedwait((sem_t *)sem->hdl, timeout);
    return OK;
}